

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

int __thiscall argo::json::operator_cast_to_int(json *this)

{
  exception_type et;
  int iVar1;
  json_exception *this_00;
  
  if ((this->m_raw_value)._M_string_length != 0) {
    this_00 = (json_exception *)__cxa_allocate_exception(0xd8);
    et = cant_cast_raw_e;
LAB_0011627c:
    json_exception::json_exception(this_00,et);
    __cxa_throw(this_00,&json_exception::typeinfo,std::exception::~exception);
  }
  if (this->m_type == number_double_e) {
    iVar1 = (int)(this->m_value).u_number_double;
  }
  else {
    if (this->m_type != number_int_e) {
      this_00 = (json_exception *)__cxa_allocate_exception(0xd8);
      et = not_number_e;
      goto LAB_0011627c;
    }
    iVar1 = (this->m_value).u_number_int;
  }
  return iVar1;
}

Assistant:

json::operator int() const
{
    if (m_raw_value.size() > 0)
    {
        throw json_exception(json_exception::cant_cast_raw_e);
    }
    else if (m_type == number_int_e)
    {
        return m_value.u_number_int;
    }
    else if (m_type == number_double_e)
    {
        return static_cast<int>(m_value.u_number_double);
    }
    else
    {
        throw json_exception(json_exception::not_number_e);
    }
}